

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O0

void __thiscall Assimp::Collada::Effect::Effect(Effect *this)

{
  Effect *this_local;
  
  this->mShadeType = Shade_Phong;
  aiColor4t<float>::aiColor4t(&this->mEmissive,0.0,0.0,0.0,1.0);
  aiColor4t<float>::aiColor4t(&this->mAmbient,0.1,0.1,0.1,1.0);
  aiColor4t<float>::aiColor4t(&this->mDiffuse,0.6,0.6,0.6,1.0);
  aiColor4t<float>::aiColor4t(&this->mSpecular,0.4,0.4,0.4,1.0);
  aiColor4t<float>::aiColor4t(&this->mTransparent,0.0,0.0,0.0,1.0);
  aiColor4t<float>::aiColor4t(&this->mReflective);
  Sampler::Sampler(&this->mTexEmissive);
  Sampler::Sampler(&this->mTexAmbient);
  Sampler::Sampler(&this->mTexDiffuse);
  Sampler::Sampler(&this->mTexSpecular);
  Sampler::Sampler(&this->mTexTransparent);
  Sampler::Sampler(&this->mTexBump);
  Sampler::Sampler(&this->mTexReflective);
  this->mShininess = 10.0;
  this->mRefractIndex = 1.0;
  this->mReflectivity = 0.0;
  this->mTransparency = 1.0;
  this->mHasTransparency = false;
  this->mRGBTransparency = false;
  this->mInvertTransparency = false;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
  ::map(&this->mParams);
  this->mDoubleSided = false;
  this->mWireframe = false;
  this->mFaceted = false;
  return;
}

Assistant:

Effect()
        : mShadeType    (Shade_Phong)
        , mEmissive     ( 0, 0, 0, 1)
        , mAmbient      ( 0.1f, 0.1f, 0.1f, 1)
        , mDiffuse      ( 0.6f, 0.6f, 0.6f, 1)
        , mSpecular     ( 0.4f, 0.4f, 0.4f, 1)
        , mTransparent  ( 0, 0, 0, 1)
        , mShininess    (10.0f)
        , mRefractIndex (1.f)
        , mReflectivity (0.f)
        , mTransparency (1.f)
        , mHasTransparency (false)
        , mRGBTransparency(false)
        , mInvertTransparency(false)
        , mDoubleSided  (false)
        , mWireframe    (false)
        , mFaceted      (false)
    {
    }